

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[64],kj::Exception&>
          (String *__return_storage_ptr__,kj *this,char (*params) [64],Exception *params_1)

{
  char *pcVar1;
  size_t sVar2;
  ArrayPtr<const_char> local_48;
  undefined8 *local_38;
  kj *local_30;
  size_t local_28;
  
  local_28 = strlen((char *)this);
  local_30 = this;
  operator*(&local_48,params);
  _::concat<kj::ArrayPtr<char_const>,kj::String>
            (__return_storage_ptr__,(_ *)&local_30,&local_48,&params_1->ownFile);
  sVar2 = local_48.size_;
  pcVar1 = local_48.ptr;
  if (local_48.ptr != (char *)0x0) {
    local_48.ptr = (char *)0x0;
    local_48.size_ = 0;
    (**(code **)*local_38)(local_38,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}